

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

PiecewiseLinearSpectrum * __thiscall
pbrt::PiecewiseLinearSpectrum::FromInterleaved
          (PiecewiseLinearSpectrum *this,span<const_float> samples,bool normalize,Allocator alloc)

{
  float *pfVar1;
  size_t sVar2;
  float *pfVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  byte bVar18;
  byte bVar19;
  void *pvVar20;
  int iVar21;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  Allocator alloc_00;
  long lVar22;
  anon_class_8_1_5ef94505 op;
  size_type __n;
  ulong uVar23;
  ushort uVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 extraout_var_00 [60];
  span<const_float> l;
  span<const_float> v_00;
  value_type vb_1;
  DispatchSplit<6> local_91;
  value_type va_1;
  undefined4 uStack_8c;
  Float local_84;
  uint local_80;
  float local_7c;
  vector<float,_std::allocator<float>_> v;
  vector<float,_std::allocator<float>_> lambda;
  uintptr_t iptr;
  PiecewiseLinearSpectrum *this_00;
  
  alloc_00.memoryResource._1_7_ = in_register_00000009;
  alloc_00.memoryResource._0_1_ = normalize;
  v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0;
  lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)samples.ptr & 1);
  if (((undefined1  [16])samples & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum.cpp"
               ,0x98,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x5e8297,
               (char (*) [19])"samples.size() % 2",(char (*) [2])0x5e8297,(int *)&v,
               (char (*) [19])"samples.size() % 2",(unsigned_long *)&lambda);
  }
  __n = (size_type)(int)((ulong)samples.ptr >> 1);
  std::vector<float,_std::allocator<float>_>::vector(&lambda,__n,(allocator_type *)&v);
  std::vector<float,_std::allocator<float>_>::vector(&v,__n,(allocator_type *)&va_1);
  if (((undefined1  [16])samples & (undefined1  [16])0x1ffffffff) != (undefined1  [16])0x0) {
    lVar22 = 0;
    do {
      lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar22] = *(float *)&(&(this->lambdas).alloc)[lVar22].memoryResource;
      *(undefined4 *)
       (CONCAT44(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                 ._M_start._4_4_,
                 v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                 ._M_start._0_4_) + lVar22 * 4) =
           *(undefined4 *)((long)&(&(this->lambdas).alloc)[lVar22].memoryResource + 4);
      if (lVar22 != 0) {
        _va_1 = CONCAT44(uStack_8c,
                         lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar22]);
        vb_1 = lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar22 + -1];
        if (lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar22] <= vb_1) {
          LogFatal<char_const(&)[10],char_const(&)[14],char_const(&)[10],float&,char_const(&)[14],float&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum.cpp"
                     ,0x9f,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [10])"lambda[i]",
                     (char (*) [14])"lambda[i - 1]",(char (*) [10])"lambda[i]",(float *)&va_1,
                     (char (*) [14])"lambda[i - 1]",&vb_1);
        }
      }
      lVar22 = lVar22 + 1;
    } while (__n + (__n == 0) != lVar22);
  }
  iVar21 = (*(alloc_00.memoryResource)->_vptr_memory_resource[2])(alloc_00.memoryResource,0x40,8);
  this_00 = (PiecewiseLinearSpectrum *)CONCAT44(extraout_var,iVar21);
  l.n = (long)lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  v_00.n = (long)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)CONCAT44(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) >> 2;
  l.ptr = lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start;
  v_00.ptr = (float *)CONCAT44(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_);
  PiecewiseLinearSpectrum(this_00,l,v_00,alloc_00);
  if ((char)samples.n != '\0') {
    uVar23 = Spectra::y | 0x2000000000000;
    auVar31 = ZEXT816(0) << 0x40;
    iVar21 = 0x168;
    do {
      local_80 = auVar31._0_4_;
      vb_1 = (value_type)iVar21;
      _va_1 = (ulong)this_00 | 0x3000000000000;
      local_7c = vb_1;
      local_84 = detail::DispatchSplit<6>::operator()
                           (&local_91,&vb_1,&va_1,((ulong)this_00 | 0x3000000000000) >> 0x30);
      vb_1 = local_7c;
      _va_1 = uVar23;
      auVar25._0_4_ = detail::DispatchSplit<6>::operator()(&local_91,&vb_1,&va_1,uVar23 >> 0x30);
      auVar25._4_60_ = extraout_var_00;
      auVar31 = vfmadd231ss_fma(ZEXT416(local_80),auVar25._0_16_,ZEXT416((uint)local_84));
      iVar21 = iVar21 + 1;
    } while (iVar21 != 0x33f);
    sVar2 = (this_00->values).nStored;
    if (sVar2 != 0) {
      pfVar3 = (this_00->values).ptr;
      uVar23 = sVar2 + 0x3fffffffffffffff;
      auVar31._0_4_ = 1.0 / (auVar31._0_4_ / 106.856895);
      auVar31._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar25 = vpbroadcastq_avx512f();
      auVar26 = vbroadcastss_avx512f(auVar31);
      lVar22 = 0;
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar29 = vpbroadcastq_avx512f();
        auVar30 = vporq_avx512f(auVar29,auVar27);
        auVar29 = vporq_avx512f(auVar29,auVar28);
        uVar17 = vpcmpuq_avx512f(auVar29,auVar25,2);
        bVar18 = (byte)uVar17;
        uVar17 = vpcmpuq_avx512f(auVar30,auVar25,2);
        bVar19 = (byte)uVar17;
        uVar24 = CONCAT11(bVar19,bVar18);
        pfVar1 = pfVar3 + lVar22;
        auVar29._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * (int)pfVar1[1];
        auVar29._0_4_ = (uint)(bVar18 & 1) * (int)*pfVar1;
        auVar29._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * (int)pfVar1[2];
        auVar29._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * (int)pfVar1[3];
        auVar29._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * (int)pfVar1[4];
        auVar29._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * (int)pfVar1[5];
        auVar29._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * (int)pfVar1[6];
        auVar29._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * (int)pfVar1[7];
        auVar29._32_4_ = (uint)(bVar19 & 1) * (int)pfVar1[8];
        auVar29._36_4_ = (uint)(bVar19 >> 1 & 1) * (int)pfVar1[9];
        auVar29._40_4_ = (uint)(bVar19 >> 2 & 1) * (int)pfVar1[10];
        auVar29._44_4_ = (uint)(bVar19 >> 3 & 1) * (int)pfVar1[0xb];
        auVar29._48_4_ = (uint)(bVar19 >> 4 & 1) * (int)pfVar1[0xc];
        auVar29._52_4_ = (uint)(bVar19 >> 5 & 1) * (int)pfVar1[0xd];
        auVar29._56_4_ = (uint)(bVar19 >> 6 & 1) * (int)pfVar1[0xe];
        auVar29._60_4_ = (uint)(bVar19 >> 7) * (int)pfVar1[0xf];
        auVar29 = vmulps_avx512f(auVar26,auVar29);
        pfVar1 = pfVar3 + lVar22;
        bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar24 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar24 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar24 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar24 >> 6) & 1);
        bVar10 = (bool)((byte)(uVar24 >> 7) & 1);
        bVar11 = (bool)(bVar19 >> 1 & 1);
        bVar12 = (bool)(bVar19 >> 2 & 1);
        bVar13 = (bool)(bVar19 >> 3 & 1);
        bVar14 = (bool)(bVar19 >> 4 & 1);
        bVar15 = (bool)(bVar19 >> 5 & 1);
        bVar16 = (bool)(bVar19 >> 6 & 1);
        *pfVar1 = (float)((uint)(bVar18 & 1) * auVar29._0_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)*pfVar1);
        pfVar1[1] = (float)((uint)bVar4 * auVar29._4_4_ | (uint)!bVar4 * (int)pfVar1[1]);
        pfVar1[2] = (float)((uint)bVar5 * auVar29._8_4_ | (uint)!bVar5 * (int)pfVar1[2]);
        pfVar1[3] = (float)((uint)bVar6 * auVar29._12_4_ | (uint)!bVar6 * (int)pfVar1[3]);
        pfVar1[4] = (float)((uint)bVar7 * auVar29._16_4_ | (uint)!bVar7 * (int)pfVar1[4]);
        pfVar1[5] = (float)((uint)bVar8 * auVar29._20_4_ | (uint)!bVar8 * (int)pfVar1[5]);
        pfVar1[6] = (float)((uint)bVar9 * auVar29._24_4_ | (uint)!bVar9 * (int)pfVar1[6]);
        pfVar1[7] = (float)((uint)bVar10 * auVar29._28_4_ | (uint)!bVar10 * (int)pfVar1[7]);
        pfVar1[8] = (float)((uint)(bVar19 & 1) * auVar29._32_4_ |
                           (uint)!(bool)(bVar19 & 1) * (int)pfVar1[8]);
        pfVar1[9] = (float)((uint)bVar11 * auVar29._36_4_ | (uint)!bVar11 * (int)pfVar1[9]);
        pfVar1[10] = (float)((uint)bVar12 * auVar29._40_4_ | (uint)!bVar12 * (int)pfVar1[10]);
        pfVar1[0xb] = (float)((uint)bVar13 * auVar29._44_4_ | (uint)!bVar13 * (int)pfVar1[0xb]);
        pfVar1[0xc] = (float)((uint)bVar14 * auVar29._48_4_ | (uint)!bVar14 * (int)pfVar1[0xc]);
        pfVar1[0xd] = (float)((uint)bVar15 * auVar29._52_4_ | (uint)!bVar15 * (int)pfVar1[0xd]);
        pfVar1[0xe] = (float)((uint)bVar16 * auVar29._56_4_ | (uint)!bVar16 * (int)pfVar1[0xe]);
        pfVar1[0xf] = (float)((uint)(bVar19 >> 7) * auVar29._60_4_ |
                             (uint)!(bool)(bVar19 >> 7) * (int)pfVar1[0xf]);
        lVar22 = lVar22 + 0x10;
      } while (((uVar23 & 0x3fffffffffffffff) + 0x10) - (ulong)((uint)uVar23 & 0xf) != lVar22);
    }
  }
  pvVar20 = (void *)CONCAT44(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_);
  if (pvVar20 != (void *)0x0) {
    operator_delete(pvVar20,(long)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)pvVar20);
  }
  if (lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return this_00;
}

Assistant:

PiecewiseLinearSpectrum *PiecewiseLinearSpectrum::FromInterleaved(
    pstd::span<const Float> samples, bool normalize, Allocator alloc) {
    CHECK_EQ(0, samples.size() % 2);
    int n = samples.size() / 2;
    std::vector<Float> lambda(n), v(n);
    for (size_t i = 0; i < n; ++i) {
        lambda[i] = samples[2 * i];
        v[i] = samples[2 * i + 1];
        if (i > 0)
            CHECK_GT(lambda[i], lambda[i - 1]);
    }

    PiecewiseLinearSpectrum *spec =
        alloc.new_object<pbrt::PiecewiseLinearSpectrum>(lambda, v, alloc);

    if (normalize)
        // Normalize to have luminance of 1.
        spec->Scale(1 / InnerProduct(spec, &Spectra::Y()));

    return spec;
}